

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

Value * duckdb::Value::BLOB(Value *__return_storage_ptr__,string *data)

{
  undefined8 in_RCX;
  string_t str;
  anon_union_16_2_67f50693_for_value local_70;
  undefined1 local_60 [16];
  string local_50;
  LogicalType local_30;
  
  LogicalType::LogicalType(&local_30,BLOB);
  Value(__return_storage_ptr__,&local_30);
  LogicalType::~LogicalType(&local_30);
  __return_storage_ptr__->is_null = false;
  string_t::string_t((string_t *)&local_70.pointer,data);
  str.value.pointer.ptr = (char *)in_RCX;
  str.value._0_8_ = local_70.pointer.ptr;
  Blob::ToBlob_abi_cxx11_((string *)(local_60 + 0x10),(Blob *)local_70._0_8_,str);
  make_shared_ptr<duckdb::StringValueInfo,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  shared_ptr<duckdb::ExtraValueInfo,_true>::operator=<duckdb::StringValueInfo,_0>
            (&__return_storage_ptr__->value_info_,
             (shared_ptr<duckdb::StringValueInfo,_true> *)local_60);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
  ::std::__cxx11::string::~string((string *)(local_60 + 0x10));
  return __return_storage_ptr__;
}

Assistant:

Value Value::BLOB(const string &data) {
	Value result(LogicalType::BLOB);
	result.is_null = false;
	result.value_info_ = make_shared_ptr<StringValueInfo>(Blob::ToBlob(string_t(data)));
	return result;
}